

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::QuantileState<short,duckdb::QuantileStandardType>,short,duckdb::QuantileListOperation<short,true>>
               (short *idata,AggregateInputData *aggr_input_data,
               QuantileState<short,_duckdb::QuantileStandardType> **states,ValidityMask *mask,
               idx_t count)

{
  unsigned_long *puVar1;
  QuantileState<short,_duckdb::QuantileStandardType> *pQVar2;
  iterator iVar3;
  short *psVar4;
  ulong uVar5;
  idx_t iVar6;
  unsigned_long uVar7;
  ulong uVar8;
  ulong uVar9;
  short local_66;
  short local_64;
  short local_62;
  short *local_60;
  ulong local_58;
  QuantileState<short,_duckdb::QuantileStandardType> **local_50;
  idx_t local_48;
  ValidityMask *local_40;
  ulong local_38;
  
  local_40 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar6 = 0;
      do {
        pQVar2 = states[iVar6];
        local_62 = idata[iVar6];
        iVar3._M_current =
             (((_Vector_base<short,_std::allocator<short>_> *)&pQVar2->v)->_M_impl).
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (((_Vector_base<short,_std::allocator<short>_> *)&pQVar2->v)->_M_impl).
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                    ((vector<short,_std::allocator<short>_> *)pQVar2,iVar3,&local_62);
        }
        else {
          *iVar3._M_current = local_62;
          (((_Vector_base<short,_std::allocator<short>_> *)&pQVar2->v)->_M_impl).
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_58 = count + 0x3f >> 6;
    local_38 = 0;
    uVar8 = 0;
    local_60 = idata;
    local_50 = states;
    local_48 = count;
    do {
      psVar4 = local_60;
      puVar1 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = 0xffffffffffffffff;
      }
      else {
        uVar7 = puVar1[local_38];
      }
      uVar5 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar5 = count;
      }
      uVar9 = uVar5;
      if (uVar7 != 0) {
        uVar9 = uVar8;
        if (uVar7 == 0xffffffffffffffff) {
          if (uVar8 < uVar5) {
            do {
              pQVar2 = states[uVar8];
              local_66 = idata[uVar8];
              iVar3._M_current =
                   (((_Vector_base<short,_std::allocator<short>_> *)&pQVar2->v)->_M_impl).
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (((_Vector_base<short,_std::allocator<short>_> *)&pQVar2->v)->_M_impl).
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                          ((vector<short,_std::allocator<short>_> *)pQVar2,iVar3,&local_66);
              }
              else {
                *iVar3._M_current = local_66;
                (((_Vector_base<short,_std::allocator<short>_> *)&pQVar2->v)->_M_impl).
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              uVar8 = uVar8 + 1;
              uVar9 = uVar8;
            } while (uVar5 != uVar8);
          }
        }
        else {
          idata = local_60;
          if (uVar8 < uVar5) {
            uVar9 = 0;
            do {
              if ((uVar7 >> (uVar9 & 0x3f) & 1) != 0) {
                pQVar2 = states[uVar8 + uVar9];
                local_64 = psVar4[uVar8 + uVar9];
                iVar3._M_current =
                     (((_Vector_base<short,_std::allocator<short>_> *)&pQVar2->v)->_M_impl).
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (((_Vector_base<short,_std::allocator<short>_> *)&pQVar2->v)->_M_impl).
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                            ((vector<short,_std::allocator<short>_> *)pQVar2,iVar3,&local_64);
                }
                else {
                  *iVar3._M_current = local_64;
                  (((_Vector_base<short,_std::allocator<short>_> *)&pQVar2->v)->_M_impl).
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
              }
              uVar9 = uVar9 + 1;
            } while ((uVar8 - uVar5) + uVar9 != 0);
            uVar9 = uVar8 + uVar9;
            states = local_50;
            idata = local_60;
            count = local_48;
          }
        }
      }
      local_38 = local_38 + 1;
      uVar8 = uVar9;
    } while (local_38 != local_58);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}